

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O3

void ggml_vec_silu_f32(int n,float *y,float *x)

{
  float fVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float fVar24;
  
  uVar5 = 0;
  if (0xf < n) {
    auVar7 = vbroadcastss_avx512f(ZEXT416(0xcb400000));
    auVar8 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
    auVar9 = vbroadcastss_avx512f(ZEXT416(0xbf317200));
    auVar10 = vbroadcastss_avx512f(ZEXT416(0xb5bfbe8e));
    auVar11 = vbroadcastss_avx512f(ZEXT416(0x43400000));
    auVar12 = vbroadcastss_avx512f(ZEXT416(0x3c072010));
    auVar13 = vbroadcastss_avx512f(ZEXT416(0x3d2b9f17));
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3e2aaf33));
    auVar15 = vbroadcastss_avx512f(ZEXT416(0x3efffedb));
    auVar16 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar17 = vbroadcastss_avx512f(ZEXT416(0x3f7ffff6));
    auVar18 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
    uVar3 = 0;
    do {
      auVar19 = vsubps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),*(undefined1 (*) [64])(x + uVar3));
      auVar20 = vfmsub231ps_avx512f(auVar7,auVar19,auVar8);
      auVar20 = vaddps_avx512f(auVar20,auVar7);
      auVar19 = vfmadd231ps_avx512f(auVar19,auVar20,auVar9);
      auVar21 = vandps_avx512dq(auVar20,auVar18);
      uVar5 = vcmpps_avx512f(auVar21,auVar11,0xe);
      auVar19 = vfmadd231ps_avx512f(auVar19,auVar20,auVar10);
      auVar21 = vfmadd213ps_avx512f(auVar12,auVar19,auVar13);
      auVar22 = vfmadd213ps_avx512f(auVar14,auVar19,auVar15);
      auVar23 = vmulps_avx512f(auVar19,auVar19);
      auVar19 = vfmadd132ps_avx512f(auVar19,auVar16,auVar17);
      auVar21 = vfmadd231ps_avx512f(auVar22,auVar23,auVar21);
      auVar19 = vfmadd231ps_avx512f(auVar19,auVar23,auVar21);
      auVar21 = vscalefps_avx512f(auVar19,auVar20);
      auVar19 = auVar21;
      if ((short)uVar5 != 0) {
        uVar4 = vcmpps_avx512f(auVar20,ZEXT1664(ZEXT816(0) << 0x40),6);
        auVar20 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        bVar2 = (bool)((byte)uVar5 & 1);
        auVar19._0_4_ =
             (uint)bVar2 * (uint)((byte)uVar4 & 1) * auVar20._0_4_ | (uint)!bVar2 * auVar21._0_4_;
        bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
        auVar19._4_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 1) & 1) * auVar20._4_4_ |
             (uint)!bVar2 * auVar21._4_4_;
        bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
        auVar19._8_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 2) & 1) * auVar20._8_4_ |
             (uint)!bVar2 * auVar21._8_4_;
        bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
        auVar19._12_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 3) & 1) * auVar20._12_4_ |
             (uint)!bVar2 * auVar21._12_4_;
        bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
        auVar19._16_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 4) & 1) * auVar20._16_4_ |
             (uint)!bVar2 * auVar21._16_4_;
        bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
        auVar19._20_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 5) & 1) * auVar20._20_4_ |
             (uint)!bVar2 * auVar21._20_4_;
        bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
        auVar19._24_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 6) & 1) * auVar20._24_4_ |
             (uint)!bVar2 * auVar21._24_4_;
        bVar2 = (bool)((byte)(uVar5 >> 7) & 1);
        auVar19._28_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 7) & 1) * auVar20._28_4_ |
             (uint)!bVar2 * auVar21._28_4_;
        bVar2 = (bool)((byte)(uVar5 >> 8) & 1);
        auVar19._32_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 8) & 1) * auVar20._32_4_ |
             (uint)!bVar2 * auVar21._32_4_;
        bVar2 = (bool)((byte)(uVar5 >> 9) & 1);
        auVar19._36_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 9) & 1) * auVar20._36_4_ |
             (uint)!bVar2 * auVar21._36_4_;
        bVar2 = (bool)((byte)(uVar5 >> 10) & 1);
        auVar19._40_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 10) & 1) * auVar20._40_4_ |
             (uint)!bVar2 * auVar21._40_4_;
        bVar2 = (bool)((byte)(uVar5 >> 0xb) & 1);
        auVar19._44_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 0xb) & 1) * auVar20._44_4_ |
             (uint)!bVar2 * auVar21._44_4_;
        bVar2 = (bool)((byte)(uVar5 >> 0xc) & 1);
        auVar19._48_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 0xc) & 1) * auVar20._48_4_ |
             (uint)!bVar2 * auVar21._48_4_;
        bVar2 = (bool)((byte)(uVar5 >> 0xd) & 1);
        auVar19._52_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 0xd) & 1) * auVar20._52_4_ |
             (uint)!bVar2 * auVar21._52_4_;
        bVar2 = (bool)((byte)(uVar5 >> 0xe) & 1);
        auVar19._56_4_ =
             (uint)bVar2 * (uint)((byte)(uVar4 >> 0xe) & 1) * auVar20._56_4_ |
             (uint)!bVar2 * auVar21._56_4_;
        bVar2 = SUB81(uVar5 >> 0xf,0);
        auVar19._60_4_ =
             (uint)bVar2 * (uint)(byte)(uVar4 >> 0xf) * auVar20._60_4_ |
             (uint)!bVar2 * auVar21._60_4_;
      }
      auVar19 = vaddps_avx512f(auVar19,auVar16);
      uVar5 = uVar3 + 0x10;
      auVar19 = vdivps_avx512f(*(undefined1 (*) [64])(x + uVar3),auVar19);
      *(undefined1 (*) [64])(y + uVar3) = auVar19;
      uVar4 = uVar3 + 0x1f;
      uVar3 = uVar5;
    } while (uVar4 < (uint)n);
  }
  if ((int)uVar5 < n) {
    uVar5 = uVar5 & 0xffffffff;
    do {
      fVar1 = x[uVar5];
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar6);
      fVar24 = expf(auVar6._0_4_);
      y[uVar5] = fVar1 / (fVar24 + 1.0);
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  return;
}

Assistant:

void ggml_vec_silu_f32(const int n, float * y, const float * x) {
    int i = 0;
#if defined(__AVX512F__) && defined(__AVX512DQ__)
    for (; i + 15 < n; i += 16) {
        _mm512_storeu_ps(y + i, ggml_v_silu(_mm512_loadu_ps(x + i)));
    }
#elif defined(__AVX2__) && defined(__FMA__)
    for (; i + 7 < n; i += 8) {
        _mm256_storeu_ps(y + i, ggml_v_silu(_mm256_loadu_ps(x + i)));
    }
#elif defined(__SSE2__)
    for (; i + 3 < n; i += 4) {
        _mm_storeu_ps(y + i, ggml_v_silu(_mm_loadu_ps(x + i)));
    }
#elif defined(__ARM_NEON) && defined(__aarch64__)
    for (; i + 3 < n; i += 4) {
        vst1q_f32(y + i, ggml_v_silu(vld1q_f32(x + i)));
    }
#endif
    for (; i < n; ++i) {
        y[i] = ggml_silu_f32(x[i]);
    }
}